

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O0

int run_test_utf8_decode1(void)

{
  uint uVar1;
  int local_3c;
  undefined1 local_38 [2];
  undefined1 auStack_36 [2];
  int i;
  char b [32];
  int *local_10;
  char *p;
  
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,"%c\x7f",0);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x22,"0 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 1)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x23,"p == b + 1");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x7f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x24,"127 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x25,"p == b + 2");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21d03);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x80) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x2a,"128 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x2b,"p == b + 2");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x7ff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x2c,"0x7FF == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != &i) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x2d,"p == b + 4");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21d43);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x800) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x32,"0x800 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 3)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x33,"p == b + 3");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x34,"0xFFFF == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)((long)&i + 2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x35,"p == b + 6");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21d8d);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x10000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x3a,"0x10000 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != &i) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x3b,"p == b + 4");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0x10ffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x3c,"0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x3d,"p == b + 8");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21dd9);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x42,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != &i) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x43,"p == b + 4");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x44,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x45,"p == b + 8");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21df9);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x4a,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x4b,"p == b + 2");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x4c,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != &i) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x4d,"p == b + 4");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21e03);
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x52,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)(local_38 + 3)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x53,"p == b + 3");
    abort();
  }
  uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
  if (uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x54,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
    abort();
  }
  if (local_10 != (int *)((long)&i + 2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
            ,0x55,"p == b + 6");
    abort();
  }
  local_10 = (int *)local_38;
  snprintf(local_38,0x20,anon_var_dwarf_21e0d);
  local_3c = 1;
  while( true ) {
    if (8 < local_3c) {
      return 0;
    }
    uVar1 = uv__utf8_decode1((char **)&local_10,b + 0x18);
    if (uVar1 != 0xffffffff) break;
    if (local_10 != (int *)(local_38 + local_3c)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
              ,0x5d,"p == b + i");
      abort();
    }
    local_3c = local_3c + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
          ,0x5c,"(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))");
  abort();
}

Assistant:

TEST_IMPL(utf8_decode1) {
  const char* p;
  char b[32];
  int i;

  /* ASCII. */
  p = b;
  snprintf(b, sizeof(b), "%c\x7F", 0x00);
  ASSERT(0 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 1);
  ASSERT(127 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);

  /* Two-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xC2\x80\xDF\xBF");
  ASSERT(128 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT(0x7FF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Three-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xE0\xA0\x80\xEF\xBF\xBF");
  ASSERT(0x800 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT(0xFFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Four-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xF0\x90\x80\x80\xF4\x8F\xBF\xBF");
  ASSERT(0x10000 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT(0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Four-byte sequences > U+10FFFF; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xF4\x90\xC0\xC0\xF7\xBF\xBF\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Overlong; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xC0\x80\xC1\x80");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Surrogate pairs; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xED\xA0\x80\xED\xA3\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Simply illegal. */
  p = b;
  snprintf(b, sizeof(b), "\xF8\xF9\xFA\xFB\xFC\xFD\xFE\xFF");

  for (i = 1; i <= 8; i++) {
    ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
    ASSERT(p == b + i);
  }

  return 0;
}